

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O1

void __thiscall
kj::_::
AdapterPromiseNode<kj::Own<capnp::ClientHook>,_kj::_::PromiseAndFulfillerAdapter<kj::Own<capnp::ClientHook>_>_>
::reject(AdapterPromiseNode<kj::Own<capnp::ClientHook>,_kj::_::PromiseAndFulfillerAdapter<kj::Own<capnp::ClientHook>_>_>
         *this,Exception *exception)

{
  ClientHook *pCVar1;
  ExceptionOr<kj::Own<capnp::ClientHook>_> local_180;
  
  if (this->waiting == true) {
    this->waiting = false;
    local_180.super_ExceptionOrValue.exception.ptr.isSet = true;
    local_180.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.ptr =
         (exception->ownFile).content.ptr;
    local_180.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.size_ =
         (exception->ownFile).content.size_;
    local_180.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.disposer =
         (exception->ownFile).content.disposer;
    (exception->ownFile).content.ptr = (char *)0x0;
    (exception->ownFile).content.size_ = 0;
    local_180.super_ExceptionOrValue.exception.ptr.field_1.value.file = exception->file;
    local_180.super_ExceptionOrValue.exception.ptr.field_1._32_4_ = exception->line;
    local_180.super_ExceptionOrValue.exception.ptr.field_1._36_4_ = exception->type;
    local_180.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.ptr =
         (exception->description).content.ptr;
    local_180.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.size_ =
         (exception->description).content.size_;
    local_180.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.disposer =
         (exception->description).content.disposer;
    (exception->description).content.ptr = (char *)0x0;
    (exception->description).content.size_ = 0;
    local_180.super_ExceptionOrValue.exception.ptr.field_1.value.context.ptr.disposer =
         (exception->context).ptr.disposer;
    local_180.super_ExceptionOrValue.exception.ptr.field_1.value.context.ptr.ptr =
         (exception->context).ptr.ptr;
    (exception->context).ptr.ptr = (Context *)0x0;
    memcpy((void *)((long)&local_180.super_ExceptionOrValue.exception.ptr.field_1 + 0x50),
           exception->trace,0x104);
    local_180.value.ptr.disposer = (Disposer *)0x0;
    local_180.value.ptr.ptr = (ClientHook *)0x0;
    ExceptionOr<kj::Own<capnp::ClientHook>_>::operator=(&this->result,&local_180);
    pCVar1 = local_180.value.ptr.ptr;
    if (local_180.value.ptr.ptr != (ClientHook *)0x0) {
      local_180.value.ptr.ptr = (ClientHook *)0x0;
      (**(local_180.value.ptr.disposer)->_vptr_Disposer)
                (local_180.value.ptr.disposer,
                 (_func_int *)((long)&pCVar1->_vptr_ClientHook + (long)pCVar1->_vptr_ClientHook[-2])
                );
    }
    if (local_180.super_ExceptionOrValue.exception.ptr.isSet == true) {
      Exception::~Exception(&local_180.super_ExceptionOrValue.exception.ptr.field_1.value);
    }
    PromiseNode::OnReadyEvent::arm(&(this->super_AdapterPromiseNodeBase).onReadyEvent);
  }
  return;
}

Assistant:

void reject(Exception&& exception) override {
    if (waiting) {
      waiting = false;
      result = ExceptionOr<T>(false, kj::mv(exception));
      setReady();
    }
  }